

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_permute_cols(m2v *M,int *colperm)

{
  int c1;
  long lVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  m2v_base *__s;
  undefined8 uStack_60;
  m2v_base amStack_58 [2];
  undefined1 local_50 [8];
  m2v ret;
  ulong uVar1;
  
  uVar5 = (ulong)(uint)M->n_col;
  lVar2 = -(uVar5 + 0xf & 0xfffffffffffffff0);
  __s = (m2v_base *)((long)amStack_58 + lVar2);
  if (0 < M->n_col) {
    uVar4 = 0;
    *(undefined8 *)((long)&uStack_60 + lVar2) = 0x101b57;
    memset(__s,0,uVar5);
    lVar2 = (long)__s - ((ulong)(uint)M->n_row * 4 + 0xf & 0xfffffffffffffff0);
    local_50._0_4_ = M->n_row;
    local_50._4_4_ = 1;
    ret.n_row = 1;
    ret._8_8_ = lVar2;
    ret.e = __s;
    do {
      if (*(char *)((long)__s + uVar4) == '\0') {
        if (uVar4 == (uint)colperm[uVar4]) {
          *(undefined1 *)((long)__s + uVar4) = 1;
        }
        else {
          c1 = (int)uVar4;
          *(undefined8 *)(lVar2 + -8) = 0x101bba;
          m2v_copy_col(M,c1,(m2v *)local_50,0);
          if (uVar4 != (uint)colperm[uVar4]) {
            uVar5 = (ulong)(uint)colperm[uVar4];
            uVar3 = uVar4 & 0xffffffff;
            do {
              uVar1 = uVar5;
              c1 = (int)uVar1;
              *(undefined1 *)((long)ret.e + (long)c1) = 1;
              *(undefined8 *)(lVar2 + -8) = 0x101be9;
              m2v_copy_col(M,c1,M,(int)uVar3);
              uVar5 = (ulong)(uint)colperm[c1];
              uVar3 = uVar1;
            } while (uVar4 != (uint)colperm[c1]);
          }
          __s = ret.e;
          *(undefined1 *)((long)ret.e + uVar4) = 1;
          *(undefined8 *)(lVar2 + -8) = 0x101c12;
          m2v_copy_col((m2v *)local_50,0,M,c1);
          uVar5 = (ulong)(uint)M->n_col;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)(int)uVar5);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}